

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ellipse.cpp
# Opt level: O1

bool __thiscall ON_Ellipse::Create(ON_Ellipse *this,ON_Plane *p,double rx,double ry)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  ON_Ellipse *pOVar4;
  
  pOVar4 = this;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pOVar4->plane).origin.x = (p->origin).x;
    p = (ON_Plane *)&(p->origin).y;
    pOVar4 = (ON_Ellipse *)&(pOVar4->plane).origin.y;
  }
  this->radius[0] = rx;
  this->radius[1] = ry;
  bVar1 = ON_Plane::IsValid(&this->plane);
  bVar2 = false;
  if ((bVar1) && (bVar2 = false, 2.3283064365386963e-10 < this->radius[0])) {
    bVar2 = 2.3283064365386963e-10 < this->radius[1];
  }
  return bVar2;
}

Assistant:

bool ON_Ellipse::Create( const ON_Plane& p, double rx, double ry )
{
  plane = p;
  radius[0] = rx;
  radius[1] = ry;
  return IsValid();
}